

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_perlin.h
# Opt level: O1

float stb_perlin_ridge_noise3
                (float x,float y,float z,float lacunarity,float gain,float offset,int octaves)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if (0 < octaves) {
    fVar5 = 0.5;
    fVar2 = 0.0;
    iVar1 = 0;
    fVar4 = 1.0;
    fVar6 = 1.0;
    do {
      fVar3 = stb_perlin_noise3_internal(fVar4 * x,fVar4 * y,fVar4 * z,0,0,0,(uchar)iVar1);
      fVar3 = (offset - ABS(fVar3)) * (offset - ABS(fVar3));
      fVar2 = fVar2 + fVar5 * fVar3 * fVar6;
      fVar4 = fVar4 * lacunarity;
      fVar5 = fVar5 * gain;
      iVar1 = iVar1 + 1;
      fVar6 = fVar3;
    } while (octaves != iVar1);
    return fVar2;
  }
  return 0.0;
}

Assistant:

float stb_perlin_ridge_noise3(float x, float y, float z, float lacunarity, float gain, float offset, int octaves)
{
   int i;
   float frequency = 1.0f;
   float prev = 1.0f;
   float amplitude = 0.5f;
   float sum = 0.0f;

   for (i = 0; i < octaves; i++) {
      float r = stb_perlin_noise3_internal(x*frequency,y*frequency,z*frequency,0,0,0,(unsigned char)i);
      r = offset - (float) fabs(r);
      r = r*r;
      sum += r*amplitude*prev;
      prev = r;
      frequency *= lacunarity;
      amplitude *= gain;
   }
   return sum;
}